

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,TagVar *arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  ArgType AVar1;
  ushort uVar2;
  ulong uVar3;
  optional<std::pair<string_view,_bool>_> *poVar4;
  bool bVar5;
  byte bVar6;
  pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool> *ppVar7;
  value_type *name;
  optional<variant<size_t,_string_view>_> *this;
  variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>
  *pvVar8;
  unsigned_long *puVar9;
  shared_ptr<Var> *psVar10;
  error_type *peVar11;
  basic_string_view<char,_std::char_traits<char>_> *name_00;
  int *piVar12;
  element_type *peVar13;
  uint *puVar14;
  unreachable_exception *puVar15;
  Reason RVar16;
  Reason RVar17;
  optional<shared_ptr<Var>_> opt_varidx;
  MatchFailure local_100;
  optional<shared_ptr<Var>_> opt_var;
  MatchFailure local_d0;
  value_type local_b8;
  SymTable *local_b0;
  optional<size_t> indexing;
  optional<int32_t> opt_const;
  optional<std::pair<string_view,_bool>_> var_ident;
  expected<Miss2Identifier,_Miss2Identifier::Error> opt_token;
  
  local_b0 = symtable;
  bVar5 = Miss2Identifier::is_identifier(&arg->ident,options);
  if (bVar5) {
    maybe_var_identifier(&var_ident,&arg->ident,arginfo);
    if (var_ident.super_OptionalBase<std::pair<libcxx_strviewclone::basic_string_view<char>,_bool>_>
        .init_ == true) {
      ppVar7 = std::experimental::
               optional<std::pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool>_>
               ::operator->(&var_ident);
      Miss2Identifier::match(&opt_token,&ppVar7->first,options);
      if (opt_token.has_value == false) {
        peVar11 = nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::error(&opt_token);
        switch(*peVar11) {
        case InvalidIdentifier:
          std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&opt_varidx,
                     &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
          opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_._8_4_ = 0xe;
          Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_var,(MatchFailure *)&opt_varidx)
          ;
          nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                    (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_var);
          break;
        case NestingOfArrays:
          std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&opt_varidx,
                     &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
          opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_._8_4_ = 0xf;
          Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_var,(MatchFailure *)&opt_varidx)
          ;
          nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                    (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_var);
          break;
        case NegativeIndex:
          std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&opt_varidx,
                     &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
          opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_._8_4_ = 0x10;
          Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_var,(MatchFailure *)&opt_varidx)
          ;
          nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                    (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_var);
          break;
        case OutOfRange:
          std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&opt_varidx,
                     &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
          opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_._8_4_ = 0x11;
          Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_var,(MatchFailure *)&opt_varidx)
          ;
          nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                    (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_var);
          break;
        default:
          puVar15 = (unreachable_exception *)__cxa_allocate_exception(0x10);
          unreachable_exception::unreachable_exception
                    (puVar15,
                     "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(309)."
                    );
          __cxa_throw(puVar15,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &opt_var.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_);
        poVar4 = (optional<std::pair<string_view,_bool>_> *)&opt_varidx;
        goto LAB_0018ffbf;
      }
      name = nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::operator*(&opt_token);
      SymTable::find_var(&opt_var,local_b0,&name->identifier,scope_ptr);
      local_b8 = arginfo;
      if (opt_var.super_OptionalBase<std::shared_ptr<Var>_>.init_ == true) {
        indexing.super_OptionalBase<unsigned_long>.init_ = false;
        indexing.super_OptionalBase<unsigned_long>.storage_.dummy_ = '\0';
        this = &name->index;
        if ((name->index).
            super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
            .init_ == true) {
          pvVar8 = std::experimental::
                   optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*(this);
          bVar5 = is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                            (pvVar8);
          if (bVar5) {
            pvVar8 = std::experimental::
                     optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::operator*(this);
            puVar9 = eggs::variants::
                     get<unsigned_long,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,0ul>
                               (pvVar8);
            std::experimental::optional<unsigned_long>::operator=(&indexing,puVar9);
          }
        }
        bVar6 = (this->
                super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                ).init_;
        if ((bool)bVar6 == true) {
          pvVar8 = std::experimental::
                   optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*(this);
          bVar5 = is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                            (pvVar8);
          if (bVar5) {
            bVar6 = (this->
                    super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                    ).init_;
            goto LAB_0018fd88;
          }
          pvVar8 = std::experimental::
                   optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*(this);
          name_00 = eggs::variants::
                    get<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,1ul>
                              (pvVar8);
          SymTable::find_var(&opt_varidx,local_b0,name_00,scope_ptr);
          if (opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.init_ == true) {
            psVar10 = std::experimental::optional<std::shared_ptr<Var>_>::operator*(&opt_varidx);
            if (((psVar10->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type == Int
               ) {
              psVar10 = std::experimental::optional<std::shared_ptr<Var>_>::operator*(&opt_varidx);
              if ((((psVar10->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->count).
                  super_OptionalBase<unsigned_int>.init_ != true) goto LAB_0019016a;
              std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,
                         &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
              local_d0.reason = VariableIndexIsArray;
              Commands::MatchFailure::MatchFailure(&local_100,&local_d0);
              nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                        (__return_storage_ptr__,
                         (unexpected_type<Commands::MatchFailure> *)&local_100);
            }
            else {
              std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,
                         &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
              local_d0.reason = VariableIndexNotInt;
              Commands::MatchFailure::MatchFailure(&local_100,&local_d0);
              nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                        (__return_storage_ptr__,
                         (unexpected_type<Commands::MatchFailure> *)&local_100);
            }
LAB_00190149:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_100.context.
                        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_d0.context.
                        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
            std::experimental::optional_base<std::shared_ptr<Var>_>::~optional_base
                      (&opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>);
            goto LAB_00190328;
          }
          Commands::find_constant_all((Commands *)&opt_const,(string_view *)commands);
          if (opt_const.super_OptionalBase<int>.init_ != true) {
            std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,
                       &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
            local_d0.reason = VariableIndexNotVar;
            Commands::MatchFailure::MatchFailure(&local_100,&local_d0);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_100)
            ;
            goto LAB_00190149;
          }
          piVar12 = std::experimental::optional<int>::operator*(&opt_const);
          local_100.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)*piVar12;
          local_100.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
          _0_1_ = true;
          std::experimental::optional<unsigned_long>::operator=
                    (&indexing,(optional<unsigned_long> *)&local_100);
          if (options->pedantic == true) {
            std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,
                       &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
            local_d0.reason = VariableIndexIsConstant;
            Commands::MatchFailure::MatchFailure(&local_100,&local_d0);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_100)
            ;
            goto LAB_00190149;
          }
LAB_0019016a:
          std::experimental::optional_base<std::shared_ptr<Var>_>::~optional_base
                    (&opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>);
        }
        else {
LAB_0018fd88:
          if (((bVar6 & 1) == 0) &&
             (psVar10 = std::experimental::optional<std::shared_ptr<Var>_>::operator*(&opt_var),
             (((psVar10->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->count).
             super_OptionalBase<unsigned_int>.init_ == true)) {
            std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_100,
                       &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
            local_100.reason = ExpectedVarIndex;
            Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_varidx,&local_100);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_varidx
                      );
            goto LAB_00190314;
          }
        }
        psVar10 = std::experimental::optional<std::shared_ptr<Var>_>::operator*(&opt_var);
        uVar2 = *(ushort *)&local_b8->field_0x1;
        if (((uVar2 & 0x10) == 0) ||
           (peVar13 = (psVar10->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
           peVar13->global == false)) {
          if ((uVar2 & 0x20) == 0) {
            RVar16 = VariableNotAllowed;
          }
          else {
            peVar13 = (psVar10->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            RVar16 = VariableKindNotAllowed;
            if (peVar13->global != true) goto LAB_001901e7;
          }
          RVar17 = VariableKindNotAllowed;
          if ((uVar2 & 0x10) == 0) {
            RVar17 = RVar16;
          }
          std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_100,
                     &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
          local_100.reason = RVar17;
          Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_varidx,&local_100);
          nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                    (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_varidx);
        }
        else {
LAB_001901e7:
          switch(peVar13->type) {
          case Int:
            switch(local_b8->type) {
            case Param:
            case Integer:
            case Constant:
              break;
            default:
switchD_00190220_caseD_1:
              std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_100,
                         &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
              local_100.reason = VariableTypeMismatch;
              Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_varidx,&local_100);
              nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                        (__return_storage_ptr__,
                         (unexpected_type<Commands::MatchFailure> *)&opt_varidx);
              goto LAB_00190314;
            case TextLabel:
            case TextLabel16:
            case String:
              if (-1 < (char)uVar2) goto switchD_00190220_caseD_1;
            }
            break;
          case Float:
            if ((local_b8->type != Param) && (local_b8->type != Float))
            goto switchD_00190220_caseD_1;
            break;
          case TextLabel:
            AVar1 = local_b8->type;
            if ((AVar1 != String) && (AVar1 != TextLabel)) {
              if (AVar1 == Param) goto LAB_001902df;
              goto switchD_00190220_caseD_1;
            }
            break;
          case TextLabel16:
            AVar1 = local_b8->type;
            if (AVar1 == Param) {
LAB_001902df:
              if ((uVar2 & 0x40) == 0) goto switchD_00190220_caseD_1;
            }
            else if ((AVar1 != TextLabel16) && (AVar1 != String)) goto switchD_00190220_caseD_1;
            break;
          default:
            puVar15 = (unreachable_exception *)__cxa_allocate_exception(0x10);
            unreachable_exception::unreachable_exception
                      (puVar15,
                       "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(291)."
                      );
            __cxa_throw(puVar15,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
          if (indexing.super_OptionalBase<unsigned_long>.init_ != true) {
LAB_001902a3:
            __return_storage_ptr__->has_value = true;
            (__return_storage_ptr__->contained).m_value = local_b8;
            goto LAB_00190328;
          }
          if ((peVar13->count).super_OptionalBase<unsigned_int>.init_ == false) {
            std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_100,
                       &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
            local_100.reason = VariableIsNotArray;
            Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_varidx,&local_100);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_varidx
                      );
          }
          else {
            puVar9 = std::experimental::optional<unsigned_long>::operator*(&indexing);
            uVar3 = *puVar9;
            puVar14 = std::experimental::optional<unsigned_int>::operator*
                                (&((psVar10->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr)->count);
            if (uVar3 < *puVar14) goto LAB_001902a3;
            std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_100,
                       &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
            local_100.reason = VariableIndexOutOfRange;
            Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_varidx,&local_100);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_varidx
                      );
          }
        }
      }
      else {
        ppVar7 = std::experimental::
                 optional<std::pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool>_>
                 ::operator->(&var_ident);
        if (ppVar7->second != true) {
          std::experimental::optional_base<std::shared_ptr<Var>_>::~optional_base
                    (&opt_var.super_OptionalBase<std::shared_ptr<Var>_>);
          goto LAB_0018ff72;
        }
        std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&local_100,
                   &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
        local_100.reason = ExpectedVar;
        Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_varidx,&local_100);
        nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                  (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_varidx);
      }
LAB_00190314:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_100.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
LAB_00190328:
      std::experimental::optional_base<std::shared_ptr<Var>_>::~optional_base
                (&opt_var.super_OptionalBase<std::shared_ptr<Var>_>);
      return __return_storage_ptr__;
    }
LAB_0018ff72:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&var_ident,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    var_ident.super_OptionalBase<std::pair<libcxx_strviewclone::basic_string_view<char>,_bool>_>.
    storage_.value_.first.__size._0_4_ = 0xd;
    Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_token,(MatchFailure *)&var_ident);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_token);
  }
  else {
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&var_ident,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    var_ident.super_OptionalBase<std::pair<libcxx_strviewclone::basic_string_view<char>,_bool>_>.
    storage_.value_.first.__size._0_4_ = 0xe;
    Commands::MatchFailure::MatchFailure((MatchFailure *)&opt_token,(MatchFailure *)&var_ident);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&opt_token);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&opt_token.contained.m_value);
  poVar4 = &var_ident;
LAB_0018ffbf:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(poVar4->
              super_OptionalBase<std::pair<libcxx_strviewclone::basic_string_view<char>,_bool>_>).
              storage_.value_);
  return __return_storage_ptr__;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      const TagVar& arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    auto var_matches = [](const shared_ptr<Var>& var, const Command::Arg& arginfo) -> bool
    {
        switch(var->type)
        {
            case VarType::Int:
                return (arginfo.type == ArgType::Integer
                     || arginfo.type == ArgType::Constant 
                     || arginfo.type == ArgType::Param 
                     || (arginfo.type == ArgType::String && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel16 && arginfo.allow_pointer));
            case VarType::Float:
                return (arginfo.type == ArgType::Float || arginfo.type == ArgType::Param);
            case VarType::TextLabel:
                return (arginfo.type == ArgType::TextLabel
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            case VarType::TextLabel16:
                return (arginfo.type == ArgType::TextLabel16
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            default:
                Unreachable();
        }
    };

    if(!Miss2Identifier::is_identifier(arg.ident, options))
        return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });

    if(auto var_ident = maybe_var_identifier(arg.ident, arginfo))
    {
        auto opt_token = Miss2Identifier::match(var_ident->first, options);
        if(!opt_token)
        {
            switch(opt_token.error())
            {
                case Miss2Identifier::InvalidIdentifier:return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });
                case Miss2Identifier::NestingOfArrays:  return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNesting });
                case Miss2Identifier::NegativeIndex:    return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNegative });
                case Miss2Identifier::OutOfRange:       return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexOutOfRange });
                default:                                Unreachable();
            }
        }

        auto& token = *opt_token;
        if(auto opt_var = symtable.find_var(token.identifier, scope_ptr))
        {
            optional<size_t> indexing;

            if(token.index != nullopt && is<size_t>(*token.index))
            {
                indexing = get<size_t>(*token.index);
            }
            if(token.index != nullopt && !is<size_t>(*token.index))
            {
                auto& index = get<string_view>(*token.index);
                if(auto opt_varidx = symtable.find_var(index, scope_ptr))
                {
                    if((*opt_varidx)->type != VarType::Int)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotInt });
                    if((*opt_varidx)->count)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsArray });
                }
                else if(auto opt_const = commands.find_constant_all(index))
                {
                    indexing = *opt_const;
                    if(options.pedantic) // TODO pedantic/warning instead of error
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsConstant });
                }
                else
                {
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotVar });
                }
            }
            else if(token.index == nullopt && (*opt_var)->count != nullopt)
            {
                return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVarIndex });
            }

            auto& var = *opt_var;
            if(!(arginfo.allow_global_var && var->global) && !(arginfo.allow_local_var && !var->global))
            {
                auto failure = arginfo.allow_global_var || arginfo.allow_local_var? MatchFailure::VariableKindNotAllowed :
                                                                                    MatchFailure::VariableNotAllowed;
                return make_unexpected(MatchFailure{ hint, failure });
            }

            if(!var_matches(var, arginfo))
                return make_unexpected(MatchFailure{ hint, MatchFailure::VariableTypeMismatch });

            if(indexing)
            {
                if(var->count == nullopt)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIsNotArray });
                else if(*indexing >= *var->count)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexOutOfRange });
            }

            return &arginfo;
        }
        else if(var_ident->second) // var not found, but required to find one?
        {
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVar });
        }
    }

    return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchVar });
}